

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

bool __thiscall
caffe::ScaleParameter::MergePartialFromCodedStream(ScaleParameter *this,CodedInputStream *input)

{
  byte bVar1;
  uint8 uVar2;
  byte *pbVar3;
  void *pvVar4;
  uint8 *puVar5;
  bool bVar6;
  uint32 uVar7;
  FillerParameter *pFVar8;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  int iVar9;
  UnknownFieldSet *unknown_fields;
  char cVar10;
  uint tag;
  ulong uVar11;
  pair<unsigned_long,_bool> pVar12;
  int local_50;
  int local_4c;
  
  do {
    pbVar3 = input->buffer_;
    uVar7 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar1 = *pbVar3;
      uVar7 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_00429c20;
      input->buffer_ = pbVar3 + 1;
      uVar11 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_00429c20:
      uVar7 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar7);
      uVar11 = 0;
      if (uVar7 - 1 < 0x7f) {
        uVar11 = 0x100000000;
      }
      uVar11 = uVar7 | uVar11;
    }
    tag = (uint)uVar11;
    if ((uVar11 & 0x100000000) == 0) goto switchD_00429ca4_default;
    cVar10 = (char)uVar11;
    switch((uint)(uVar11 >> 3) & 0x1fffffff) {
    case 1:
      if (cVar10 != '\b') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
      pbVar3 = input->buffer_;
      if (pbVar3 < input->buffer_end_) {
        bVar1 = *pbVar3;
        uVar11 = (ulong)bVar1;
        uVar7 = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_00429e1f;
        input->buffer_ = pbVar3 + 1;
        bVar6 = true;
      }
      else {
        uVar7 = 0;
LAB_00429e1f:
        uVar11 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
        bVar6 = -1 < (long)uVar11;
      }
      iVar9 = 6;
      if (bVar6) {
        this->axis_ = (int32)uVar11;
        goto LAB_00429c81;
      }
      goto LAB_00429c83;
    case 2:
      if (cVar10 == '\x10') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x10;
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar1 = *pbVar3;
          uVar11 = (ulong)bVar1;
          uVar7 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_00429e47;
          input->buffer_ = pbVar3 + 1;
          bVar6 = true;
        }
        else {
          uVar7 = 0;
LAB_00429e47:
          uVar11 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
          bVar6 = -1 < (long)uVar11;
        }
        iVar9 = 6;
        if (bVar6) {
          this->num_axes_ = (int32)uVar11;
          goto LAB_00429c81;
        }
        goto LAB_00429c83;
      }
      break;
    case 3:
      if (cVar10 != '\x1a') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      if (this->filler_ == (FillerParameter *)0x0) {
        pFVar8 = (FillerParameter *)operator_new(0x40);
        FillerParameter::FillerParameter(pFVar8);
        this->filler_ = pFVar8;
      }
      MergePartialFromCodedStream();
      iVar9 = local_4c;
      if ((extraout_RAX_00 & 1) != 0) goto LAB_00429c83;
      goto LAB_00429c81;
    case 4:
      if (cVar10 == ' ') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) && (uVar2 = *puVar5, -1 < (long)(char)uVar2)) {
          input->buffer_ = puVar5 + 1;
          pVar12._8_8_ = 1;
          pVar12.first = (long)(char)uVar2;
        }
        else {
          pVar12 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        }
        iVar9 = 6;
        if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          this->bias_term_ = pVar12.first != 0;
          goto LAB_00429c81;
        }
        goto LAB_00429c83;
      }
      break;
    case 5:
      if (cVar10 == '*') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
        if (this->bias_filler_ == (FillerParameter *)0x0) {
          pFVar8 = (FillerParameter *)operator_new(0x40);
          FillerParameter::FillerParameter(pFVar8);
          this->bias_filler_ = pFVar8;
        }
        MergePartialFromCodedStream();
        iVar9 = local_50;
        if ((extraout_RAX & 1) == 0) goto LAB_00429c81;
        goto LAB_00429c83;
      }
    }
switchD_00429ca4_default:
    iVar9 = 7;
    if ((tag & 7) != 4 && tag != 0) {
      pvVar4 = (this->_internal_metadata_).
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               .ptr_;
      if (((ulong)pvVar4 & 1) == 0) {
        unknown_fields =
             google::protobuf::internal::
             InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ::mutable_unknown_fields_slow
                       (&(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       );
      }
      else {
        unknown_fields = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
      }
      bVar6 = google::protobuf::internal::WireFormat::SkipField(input,tag,unknown_fields);
      if (bVar6) {
LAB_00429c81:
        iVar9 = 0;
      }
      else {
        iVar9 = 6;
      }
    }
LAB_00429c83:
    if (iVar9 != 0) {
      return iVar9 != 6;
    }
  } while( true );
}

Assistant:

bool ScaleParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.ScaleParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional int32 axis = 1 [default = 1];
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          set_has_axis();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &axis_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional int32 num_axes = 2 [default = 1];
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          set_has_num_axes();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &num_axes_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.FillerParameter filler = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_filler()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool bias_term = 4 [default = false];
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(32u)) {
          set_has_bias_term();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &bias_term_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.FillerParameter bias_filler = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(42u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_bias_filler()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.ScaleParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.ScaleParameter)
  return false;
#undef DO_
}